

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_joy.cpp
# Opt level: O1

bool M_SetJoystickConfigSection(IJoystickConfig *joy,bool create)

{
  bool bVar1;
  FString id;
  FString local_20;
  FString local_18;
  
  FString::FString(&local_20,"Joy:");
  (*joy->_vptr_IJoystickConfig[0x12])(&local_18,joy);
  FString::operator+=(&local_20,&local_18);
  FString::~FString(&local_18);
  bVar1 = FConfigFile::SetSection(&GameConfig->super_FConfigFile,local_20.Chars,create);
  FString::~FString(&local_20);
  return bVar1;
}

Assistant:

static bool M_SetJoystickConfigSection(IJoystickConfig *joy, bool create)
{
	FString id = "Joy:";
	id += joy->GetIdentifier();
	return GameConfig->SetSection(id, create);
}